

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void SQCompilation::StaticAnalyzer::mergeKnownBindings(HSQOBJECT *bindings)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  int *in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar1;
  SQChar *s;
  SQInteger len;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr pos;
  SQInteger idx;
  SQTable *table;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_ffffffffffffff38;
  SQObjectPtr *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  SQObjectPtr *in_stack_ffffffffffffff58;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  undefined1 local_89 [33];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  long local_60;
  int local_38;
  long local_30;
  SQObjectPtr local_28;
  SQObjectPtr *local_18;
  undefined8 local_10;
  
  if ((in_RDI != (int *)0x0) && (*in_RDI == 0xa000020)) {
    local_10 = *(undefined8 *)(in_RDI + 2);
    local_18 = (SQObjectPtr *)0x0;
    ::SQObjectPtr::SQObjectPtr(&local_28,0);
    ::SQObjectPtr::SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    ::SQObjectPtr::SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    while( true ) {
      in_stack_ffffffffffffff58 =
           (SQObjectPtr *)
           SQTable::Next((SQTable *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                         SUB81((ulong)in_stack_ffffffffffffff60._M_cur >> 0x38,0),
                         in_stack_ffffffffffffff58,(SQObjectPtr *)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48);
      local_18 = in_stack_ffffffffffffff58;
      if ((long)in_stack_ffffffffffffff58 < 0) break;
      if (local_38 == 0x8000010) {
        local_60 = *(long *)(local_30 + 0x28);
        this = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_30 + 0x38);
        in_stack_ffffffffffffff48 = (SQObjectPtr *)((long)&(this->_M_h)._M_buckets + local_60);
        in_stack_ffffffffffffff50 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
        local_68 = this;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,(char *)this,
                   (allocator<char> *)in_stack_ffffffffffffff38._M_cur);
        pVar1 = std::
                unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::emplace<std::__cxx11::string>
                          (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff38._M_cur);
        in_stack_ffffffffffffff38._M_cur =
             (__node_type *)
             pVar1.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
        in_stack_ffffffffffffff37 = pVar1.second;
        in_stack_ffffffffffffff60._M_cur = in_stack_ffffffffffffff38._M_cur;
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff37;
        std::__cxx11::string::~string((string *)(local_89 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_89);
      }
      local_28.super_SQObject._unVal.nInteger = (SQInteger)local_18;
    }
    ::SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    ::SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    ::SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  return;
}

Assistant:

void StaticAnalyzer::mergeKnownBindings(const HSQOBJECT *bindings) {
  if (bindings && sq_istable(*bindings)) {
    SQTable *table = _table(*bindings);

    SQInteger idx = 0;
    SQObjectPtr pos(idx), key, val;

    while ((idx = table->Next(false, pos, key, val)) >= 0) {
      if (sq_isstring(key)) {
        SQInteger len = _string(key)->_len;
        const SQChar *s = _string(key)->_val;
        knownBindings.emplace(std::string(s, s+len));
      }
      pos._unVal.nInteger = idx;
    }
  }
}